

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.h
# Opt level: O0

uint8_t * cbor_map_parse<cdnsPreamble>(uint8_t *in,uint8_t *in_max,cdnsPreamble *v,int *err)

{
  bool bVar1;
  long local_48;
  int64_t inner_val;
  int inner_type;
  int is_undef;
  int64_t val;
  int *piStack_28;
  int outer_type;
  int *err_local;
  cdnsPreamble *v_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  
  val._4_4_ = (int)(uint)*in >> 5;
  inner_val._4_4_ = 0;
  piStack_28 = err;
  err_local = (int *)v;
  v_local = (cdnsPreamble *)in_max;
  in_max_local = in;
  in_max_local = cbor_get_number(in,in_max,(int64_t *)&inner_type);
  if ((in_max_local == (uint8_t *)0x0) || (val._4_4_ != 5)) {
    *piStack_28 = -3;
    in_max_local = (uint8_t *)0x0;
  }
  else {
    if (_inner_type == -1) {
      inner_val._4_4_ = 1;
      _inner_type = 0xffffffff;
    }
    while( true ) {
      bVar1 = false;
      if ((0 < _inner_type) && (bVar1 = false, in_max_local != (uint8_t *)0x0)) {
        bVar1 = in_max_local < v_local;
      }
      if (!bVar1) {
        return in_max_local;
      }
      if (*in_max_local == 0xff) break;
      inner_val._0_4_ = (int)(uint)*in_max_local >> 5;
      in_max_local = cbor_get_number(in_max_local,(uint8_t *)v_local,&local_48);
      if ((in_max_local == (uint8_t *)0x0) || (((int)inner_val != 0 && ((int)inner_val != 1)))) {
        *piStack_28 = -3;
        in_max_local = (uint8_t *)0x0;
      }
      else {
        if ((int)inner_val == 1) {
          local_48 = -(local_48 + 1);
        }
        in_max_local = cdnsPreamble::parse_map_item
                                 ((cdnsPreamble *)err_local,in_max_local,(uint8_t *)v_local,local_48
                                  ,piStack_28);
        _inner_type = _inner_type + -1;
      }
    }
    if (inner_val._4_4_ == 0) {
      *piStack_28 = -3;
      in_max_local = (uint8_t *)0x0;
    }
    else {
      in_max_local = in_max_local + 1;
    }
  }
  return in_max_local;
}

Assistant:

uint8_t* cbor_map_parse(uint8_t* in, uint8_t const* in_max, InnerClass * v, int* err)
{

    int outer_type = CBOR_CLASS(*in);
    int64_t val;
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in == NULL || outer_type != CBOR_T_MAP) {
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }
    else {
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                if (is_undef) {
                    in++;
                }
                else {
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (in == NULL || (inner_type != CBOR_T_UINT && inner_type != CBOR_T_NINT)) {
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (inner_type == CBOR_T_NINT) {
                        inner_val = -(inner_val + 1);
                    }
                    in = v->parse_map_item(in, in_max, inner_val, err);
                    val--;
                }
            }
        }
    }

    return in;
}